

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapCurrentValue(jx9_context *pCtx,jx9_hashmap *pMap,int iDirection)

{
  jx9_value *pValue;
  jx9_value *pVal;
  jx9_hashmap_node *pCur;
  int iDirection_local;
  jx9_hashmap *pMap_local;
  jx9_context *pCtx_local;
  
  pVal = (jx9_value *)pMap->pCur;
  if ((jx9_hashmap_node *)pVal == (jx9_hashmap_node *)0x0) {
    jx9_result_bool(pCtx,0);
  }
  else {
    if (iDirection != 0) {
      if (iDirection < 1) {
        pMap->pCur = ((jx9_hashmap_node *)pVal)->pNext;
        pVal = (jx9_value *)pMap->pCur;
      }
      else {
        pMap->pCur = ((jx9_hashmap_node *)pVal)->pPrev;
        pVal = (jx9_value *)pMap->pCur;
      }
      if (pVal == (jx9_value *)0x0) {
        jx9_result_bool(pCtx,0);
        return 0;
      }
    }
    pValue = HashmapExtractNodeValue((jx9_hashmap_node *)pVal);
    if (pValue == (jx9_value *)0x0) {
      jx9_result_bool(pCtx,0);
    }
    else {
      jx9_result_value(pCtx,pValue);
    }
  }
  return 0;
}

Assistant:

static sxi32 HashmapCurrentValue(jx9_context *pCtx, jx9_hashmap *pMap, int iDirection)
{
	jx9_hashmap_node *pCur = pMap->pCur;
	jx9_value *pVal;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( iDirection != 0 ){
		if( iDirection > 0 ){
			/* Point to the next entry */
			pMap->pCur = pCur->pPrev; /* Reverse link */
			pCur = pMap->pCur;
		}else{
			/* Point to the previous entry */
			pMap->pCur = pCur->pNext; /* Reverse link */
			pCur = pMap->pCur;
		}
		if( pCur == 0 ){
			/* End of input reached, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
	}		
	/* Point to the desired element */
	pVal = HashmapExtractNodeValue(pCur);
	if( pVal ){
		jx9_result_value(pCtx, pVal);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}